

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_materialized_collector.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalMaterializedCollector::GetLocalSinkState
          (PhysicalMaterializedCollector *this,ExecutionContext *context)

{
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  __p;
  Allocator *args;
  pointer pMVar1;
  pointer this_00;
  __uniq_ptr_impl<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
  local_20;
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  local_18;
  
  make_uniq<duckdb::MaterializedCollectorLocalState>();
  args = Allocator::DefaultAllocator();
  make_uniq<duckdb::ColumnDataCollection,duckdb::Allocator&,duckdb::vector<duckdb::LogicalType,true>const&>
            ((duckdb *)&local_18,args,(vector<duckdb::LogicalType,_true> *)&context[1].pipeline);
  pMVar1 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_20);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
       .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>)
       (_Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
        )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)&pMVar1->collection,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                   .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl);
  ::std::
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)&local_18);
  pMVar1 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_20);
  this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
            ::operator->(&pMVar1->collection);
  pMVar1 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_20);
  ColumnDataCollection::InitializeAppend(this_00,&pMVar1->append_state);
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::MaterializedCollectorLocalState_*,_std::default_delete<duckdb::MaterializedCollectorLocalState>_>
       .super__Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalMaterializedCollector::GetLocalSinkState(ExecutionContext &context) const {
	auto state = make_uniq<MaterializedCollectorLocalState>();
	state->collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);
	state->collection->InitializeAppend(state->append_state);
	return std::move(state);
}